

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dac.c
# Opt level: O3

void * adc_new(t_symbol *s,int argc,t_atom *argv)

{
  t_object *owner;
  _gobj *p_Var1;
  int argc_00;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  t_float tVar5;
  t_atom defarg [2];
  t_atom local_48;
  undefined4 local_38;
  undefined4 local_30;
  
  uVar3 = (ulong)(uint)argc;
  owner = (t_object *)pd_new(adc_class);
  if (argc == 0) {
    local_48.a_type = A_FLOAT;
    local_48.a_w.w_index = 0x3f800000;
    local_38 = 1;
    local_30 = 0x40000000;
    uVar3 = 2;
    argv = &local_48;
  }
  argc_00 = (int)uVar3;
  owner[1].te_g.g_pd = (t_pd)(long)argc_00;
  p_Var1 = (_gobj *)getbytes((long)argc_00 << 3);
  owner[1].te_g.g_next = p_Var1;
  if (0 < argc_00) {
    uVar4 = 0;
    do {
      tVar5 = atom_getfloatarg((int)uVar4,argc_00,argv);
      (&(owner[1].te_g.g_next)->g_pd)[uVar4] = (t_pd)(long)tVar5;
      uVar4 = uVar4 + 1;
    } while (uVar3 != uVar4);
    if (0 < argc_00) {
      do {
        outlet_new(owner,&s_signal);
        uVar2 = (int)uVar3 - 1;
        uVar3 = (ulong)uVar2;
      } while (uVar2 != 0);
    }
  }
  return owner;
}

Assistant:

static void *adc_new(t_symbol *s, int argc, t_atom *argv)
{
    t_adc *x = (t_adc *)pd_new(adc_class);
    t_atom defarg[2];
    int i;
    if (!argc)
    {
        argv = defarg;
        argc = 2;
        SETFLOAT(&defarg[0], 1);
        SETFLOAT(&defarg[1], 2);
    }
    x->x_n = argc;
    x->x_vec = (t_int *)getbytes(argc * sizeof(*x->x_vec));
    for (i = 0; i < argc; i++)
        x->x_vec[i] = atom_getfloatarg(i, argc, argv);
    for (i = 0; i < argc; i++)
        outlet_new(&x->x_obj, &s_signal);
    return (x);
}